

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5TokendataIterAppendMap
               (Fts5Index *p,Fts5TokenDataIter *pT,int iIter,int nByte,i64 iRowid,i64 iPos)

{
  int iVar1;
  Fts5TokenDataMap *pFVar2;
  int iVar3;
  u64 nBytes;
  
  if (p->rc != 0) {
    return;
  }
  iVar1 = pT->nMap;
  if (iVar1 == pT->nMapAlloc) {
    iVar3 = 0x40;
    if (iVar1 != 0) {
      iVar3 = iVar1 * 2;
    }
    pFVar2 = pT->aMap;
    iVar1 = sqlite3_initialize();
    if (iVar1 == 0) {
      nBytes = 0;
      if (0 < iVar3 * 0x18) {
        nBytes = (u64)(uint)(iVar3 * 0x18);
      }
      pFVar2 = (Fts5TokenDataMap *)sqlite3Realloc(pFVar2,nBytes);
      if (pFVar2 != (Fts5TokenDataMap *)0x0) {
        pT->aMap = pFVar2;
        pT->nMapAlloc = iVar3;
        iVar1 = pT->nMap;
        goto LAB_001e11f0;
      }
    }
    p->rc = 7;
  }
  else {
    pFVar2 = pT->aMap;
LAB_001e11f0:
    pFVar2[iVar1].iRowid = iRowid;
    pFVar2[iVar1].iPos = iPos;
    pFVar2[iVar1].iIter = iIter;
    pFVar2[iVar1].nByte = nByte;
    pT->nMap = iVar1 + 1;
  }
  return;
}

Assistant:

static void fts5TokendataIterAppendMap(
  Fts5Index *p,
  Fts5TokenDataIter *pT,
  int iIter,
  int nByte,
  i64 iRowid,
  i64 iPos
){
  if( p->rc==SQLITE_OK ){
    if( pT->nMap==pT->nMapAlloc ){
      int nNew = pT->nMapAlloc ? pT->nMapAlloc*2 : 64;
      int nAlloc = nNew * sizeof(Fts5TokenDataMap);
      Fts5TokenDataMap *aNew;

      aNew = (Fts5TokenDataMap*)sqlite3_realloc(pT->aMap, nAlloc);
      if( aNew==0 ){
        p->rc = SQLITE_NOMEM;
        return;
      }

      pT->aMap = aNew;
      pT->nMapAlloc = nNew;
    }

    pT->aMap[pT->nMap].iRowid = iRowid;
    pT->aMap[pT->nMap].iPos = iPos;
    pT->aMap[pT->nMap].iIter = iIter;
    pT->aMap[pT->nMap].nByte = nByte;
    pT->nMap++;
  }
}